

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUint32x4OperationX86X64.cpp
# Opt level: O2

SIMDValue Js::SIMDUint32x4Operation::OpMin(SIMDValue *aValue,SIMDValue *bValue)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar9;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 local_18;
  
  uVar1 = (aValue->field_0).u32[0];
  uVar2 = (aValue->field_0).u32[1];
  uVar3 = (aValue->field_0).u32[2];
  uVar4 = (aValue->field_0).u32[3];
  uVar5 = (bValue->field_0).u32[0];
  uVar6 = (bValue->field_0).u32[1];
  uVar7 = (bValue->field_0).u32[2];
  uVar8 = (bValue->field_0).u32[3];
  local_18.u32[0] =
       -(uint)(((uVar5 < uVar1) * uVar5 | (uVar5 >= uVar1) * uVar1) == uVar5) ^ 0xffffffff;
  local_18.u32[1] =
       -(uint)(((uVar6 < uVar2) * uVar6 | (uVar6 >= uVar2) * uVar2) == uVar6) ^ 0xffffffff;
  local_18.u32[2] =
       -(uint)(((uVar7 < uVar3) * uVar7 | (uVar7 >= uVar3) * uVar3) == uVar7) ^ 0xffffffff;
  local_18.u32[3] =
       -(uint)(((uVar8 < uVar4) * uVar8 | (uVar8 >= uVar4) * uVar4) == uVar8) ^ 0xffffffff;
  aVar9 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          SIMDInt32x4Operation::OpSelect((SIMDValue *)&local_18,aValue,bValue);
  return (SIMDValue)aVar9;
}

Assistant:

SIMDValue SIMDUint32x4Operation::OpMin(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        // _mm_min_epu32 is SSE4.1
        //X86SIMDValue x86Result;
        //X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        //X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);

        //x86Result.m128i_value = _mm_min_epu32(tmpaValue.m128i_value, tmpbValue.m128i_value);

        SIMDValue selector = SIMDUint32x4Operation::OpLessThan(aValue, bValue);
        return SIMDInt32x4Operation::OpSelect(selector, aValue, bValue);
    }